

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void helper_ljmp_protected_x86_64
               (CPUX86State *env,int new_cs,target_ulong new_eip,target_ulong next_eip)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uintptr_t unaff_retaddr;
  uint32_t e1;
  uint32_t e2;
  
  uVar9 = new_cs & 0xfffc;
  if (uVar9 == 0) {
    raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
  }
  iVar3 = load_segment_ra(env,&e1,&e2,new_cs,unaff_retaddr);
  uVar2 = e1;
  if (iVar3 == 0) {
    uVar8 = env->hflags & 3;
    if ((e2 >> 0xc & 1) == 0) {
      uVar5 = e2 >> 8 & 0xf;
      uVar4 = (uint)env->efer;
      if ((uVar5 == 0xc || (uVar4 >> 10 & 1) == 0) && (uVar5 < 0xd)) {
        uVar6 = e2 >> 0xd & 3;
        if ((0x222U >> uVar5 & 1) == 0) {
          if ((((0x1010U >> uVar5 & 1) != 0) && (uVar8 <= uVar6)) && ((new_cs & 3U) <= uVar6)) {
            if ((short)e2 < 0) {
              uVar6 = 0;
              if (uVar5 == 0xc) {
                uVar6 = e2 & 0xffff0000;
              }
              uVar6 = uVar6 | e1 & 0xffff;
              uVar7 = (ulong)uVar6;
              if ((uVar4 >> 10 & 1) != 0) {
                iVar3 = load_segment_ra(env,&e1,&e2,new_cs + 8,unaff_retaddr);
                if ((iVar3 != 0) || ((e2 & 0x1f00) != 0)) goto LAB_004d799a;
                uVar7 = CONCAT44(e1,uVar6);
              }
              uVar9 = uVar2 >> 0x10;
              iVar3 = load_segment_ra(env,&e1,&e2,uVar9,unaff_retaddr);
              if ((iVar3 == 0) && ((~e2 & 0x1800) == 0)) {
                uVar4 = e2 >> 0xd & 3;
                bVar1 = uVar4 <= uVar8;
                if ((e2 >> 10 & 1) == 0) {
                  bVar1 = uVar4 == uVar8;
                }
                if ((bVar1) &&
                   ((((env->efer & 0x400) == 0 ||
                     (((e2 >> 0x15 & 1) != 0 && ((e2 >> 0x16 & 1) == 0)))) && ((short)e2 < 0)))) {
                  uVar5 = e2 & 0xf0000 | e1 & 0xffff;
                  uVar4 = uVar5 << 0xc | 0xfff;
                  if ((e2 >> 0x17 & 1) == 0) {
                    uVar4 = uVar5;
                  }
                  if ((uVar7 <= uVar4) || (((e2 >> 0x15 & 1) != 0 && ((env->hflags & 0x4000) != 0)))
                     ) {
                    cpu_x86_load_seg_cache
                              (env,1,uVar9 & 0xfffffffc | uVar8,
                               (ulong)(e2 & 0xff000000 | (e2 & 0xff) << 0x10 | e1 >> 0x10),uVar4,e2)
                    ;
                    env->eip = uVar7;
                    return;
                  }
                  goto LAB_004d79d0;
                }
              }
              uVar9 = uVar9 & 0xfffffffc;
              iVar3 = 0xd;
              goto LAB_004d79a3;
            }
LAB_004d79cc:
            iVar3 = 0xb;
            goto LAB_004d79a3;
          }
        }
        else if ((uVar8 <= uVar6) && ((new_cs & 3U) <= uVar6)) {
          switch_tss_ra(env,new_cs,e1,e2,0,(uint32_t)next_eip,unaff_retaddr);
          return;
        }
      }
    }
    else if ((e2 >> 0xb & 1) != 0) {
      uVar4 = e2 >> 0xd & 3;
      if ((e2 >> 10 & 1) == 0) {
        if (((new_cs & 3U) <= uVar8) && (uVar4 == uVar8)) {
LAB_004d7780:
          if ((short)e2 < 0) {
            uVar5 = e2 & 0xf0000 | e1 & 0xffff;
            uVar4 = uVar5 << 0xc | 0xfff;
            if ((e2 >> 0x17 & 1) == 0) {
              uVar4 = uVar5;
            }
            if ((new_eip <= uVar4) || (((env->hflags >> 0xe & 1) != 0 && ((e2 & 0x200000) != 0)))) {
              cpu_x86_load_seg_cache
                        (env,1,uVar8 | uVar9,
                         (ulong)(e2 & 0xff000000 | (e2 & 0xff) << 0x10 | e1 >> 0x10),uVar4,e2);
              env->eip = new_eip;
              return;
            }
LAB_004d79d0:
            iVar3 = 0xd;
            uVar9 = 0;
            goto LAB_004d79a3;
          }
          goto LAB_004d79cc;
        }
      }
      else if (uVar4 <= uVar8) goto LAB_004d7780;
    }
  }
LAB_004d799a:
  iVar3 = 0xd;
LAB_004d79a3:
  raise_exception_err_ra_x86_64(env,iVar3,uVar9,unaff_retaddr);
}

Assistant:

void helper_ljmp_protected(CPUX86State *env, int new_cs, target_ulong new_eip,
                           target_ulong next_eip)
{
    int gate_cs, type;
    uint32_t e1, e2, cpl, dpl, rpl, limit;

    if ((new_cs & 0xfffc) == 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
    if (load_segment_ra(env, &e1, &e2, new_cs, GETPC()) != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
    }
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if (!(e2 & DESC_CS_MASK)) {
            raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
        }
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (e2 & DESC_C_MASK) {
            /* conforming code segment */
            if (dpl > cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        } else {
            /* non conforming code segment */
            rpl = new_cs & 3;
            if (rpl > cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            if (dpl != cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, new_cs & 0xfffc, GETPC());
        }
        limit = get_seg_limit(e1, e2);
        if (new_eip > limit &&
            (!(env->hflags & HF_LMA_MASK) || !(e2 & DESC_L_MASK))) {
            raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
        }
        cpu_x86_load_seg_cache(env, R_CS, (new_cs & 0xfffc) | cpl,
                       get_seg_base(e1, e2), limit, e2);
        env->eip = new_eip;
    } else {
        /* jump to call or task gate */
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        rpl = new_cs & 3;
        cpl = env->hflags & HF_CPL_MASK;
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;

#ifdef TARGET_X86_64
        if (env->efer & MSR_EFER_LMA) {
            if (type != 12) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        }
#endif
        switch (type) {
        case 1: /* 286 TSS */
        case 9: /* 386 TSS */
        case 5: /* task gate */
            if (dpl < cpl || dpl < rpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            switch_tss_ra(env, new_cs, e1, e2, SWITCH_TSS_JMP, next_eip, GETPC());
            break;
        case 4: /* 286 call gate */
        case 12: /* 386 call gate */
            if ((dpl < cpl) || (dpl < rpl)) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            if (!(e2 & DESC_P_MASK)) {
                raise_exception_err_ra(env, EXCP0B_NOSEG, new_cs & 0xfffc, GETPC());
            }
            gate_cs = e1 >> 16;
            new_eip = (e1 & 0xffff);
            if (type == 12) {
                new_eip |= (e2 & 0xffff0000);
            }

#ifdef TARGET_X86_64
            if (env->efer & MSR_EFER_LMA) {
                /* load the upper 8 bytes of the 64-bit call gate */
                if (load_segment_ra(env, &e1, &e2, new_cs + 8, GETPC())) {
                    raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc,
                                           GETPC());
                }
                type = (e2 >> DESC_TYPE_SHIFT) & 0x1f;
                if (type != 0) {
                    raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc,
                                           GETPC());
                }
                new_eip |= ((target_ulong)e1) << 32;
            }
#endif

            if (load_segment_ra(env, &e1, &e2, gate_cs, GETPC()) != 0) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            dpl = (e2 >> DESC_DPL_SHIFT) & 3;
            /* must be code segment */
            if (((e2 & (DESC_S_MASK | DESC_CS_MASK)) !=
                 (DESC_S_MASK | DESC_CS_MASK))) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            if (((e2 & DESC_C_MASK) && (dpl > cpl)) ||
                (!(e2 & DESC_C_MASK) && (dpl != cpl))) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
#ifdef TARGET_X86_64
            if (env->efer & MSR_EFER_LMA) {
                if (!(e2 & DESC_L_MASK)) {
                    raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
                }
                if (e2 & DESC_B_MASK) {
                    raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
                }
            }
#endif
            if (!(e2 & DESC_P_MASK)) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            limit = get_seg_limit(e1, e2);
            if (new_eip > limit &&
                (!(env->hflags & HF_LMA_MASK) || !(e2 & DESC_L_MASK))) {
                raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
            }
            cpu_x86_load_seg_cache(env, R_CS, (gate_cs & 0xfffc) | cpl,
                                   get_seg_base(e1, e2), limit, e2);
            env->eip = new_eip;
            break;
        default:
            raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            break;
        }
    }
}